

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O0

uint SOIL_direct_load_DDS_from_memory
               (uchar *buffer,int buffer_length,uint reuse_texture_ID,int flags,
               int loading_as_cubemap)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  uchar *img_data;
  uint uVar4;
  int local_118;
  uint clamp_mode;
  int mip_size;
  int h_1;
  int w_1;
  uint uStack_104;
  uchar temp;
  uint byte_offset;
  int h;
  int w;
  int shift_offset;
  int i;
  uint opengl_texture_type;
  uint ogl_target_end;
  uint ogl_target_start;
  uint cf_target;
  uint flag;
  int block_size;
  int uncompressed;
  int cubemap;
  int mipmaps;
  uint height;
  uint width;
  uint DDS_full_size;
  uint DDS_main_size;
  uchar *DDS_data;
  uint local_b0;
  uint S3TC_type;
  uint tex_ID;
  uint buffer_index;
  DDS_header header;
  int loading_as_cubemap_local;
  int flags_local;
  uint reuse_texture_ID_local;
  int buffer_length_local;
  uchar *buffer_local;
  
  S3TC_type = 0;
  local_b0 = 0;
  DDS_data._4_4_ = 0;
  cf_target = 0x10;
  if (buffer == (uchar *)0x0) {
    result_string_pointer = "NULL buffer";
    buffer_local._4_4_ = 0;
  }
  else if ((uint)buffer_length < 0x80) {
    result_string_pointer = "DDS file was too small to contain the DDS header";
    buffer_local._4_4_ = 0;
  }
  else {
    header.sCaps.dwReserved = loading_as_cubemap;
    header.dwReserved2 = flags;
    memcpy(&tex_ID,buffer,0x80);
    S3TC_type = 0x80;
    result_string_pointer = "Failed to read a known DDS header";
    if ((((((tex_ID == 0x20534444) && (buffer_index == 0x7c)) &&
          ((header.dwMagic & 0x1007) == 0x1007)) &&
         (((header.dwReserved1[10] & 0x44) != 0 && (header.dwReserved1[9] == 0x20)))) &&
        ((header.sPixelFormat.dwBBitMask & 0x1000) != 0)) &&
       ((((header.dwReserved1[10] & 4) == 0 || (header.sPixelFormat.dwSize == 0x31545844)) ||
        ((header.sPixelFormat.dwSize == 0x33545844 || (header.sPixelFormat.dwSize == 0x35545844)))))
       ) {
      result_string_pointer = "DDS header loaded and validated";
      uVar4 = (header.dwReserved1[10] & 4) >> 2;
      if (uVar4 == 1) {
        iVar3 = query_DXT_capability();
        if (iVar3 != 1) {
          result_string_pointer = "Direct upload of S3TC images not supported by the OpenGL driver";
          return 0;
        }
        uVar2 = header.sPixelFormat.dwSize >> 0x18;
        if (uVar2 == 0x31) {
          DDS_data._4_4_ = 0x83f1;
          cf_target = 8;
        }
        else if (uVar2 == 0x33) {
          DDS_data._4_4_ = 0x83f2;
          cf_target = 0x10;
        }
        else if (uVar2 == 0x35) {
          DDS_data._4_4_ = 0x83f3;
          cf_target = 0x10;
        }
        width = (header.dwFlags + 3 >> 2) * (header.dwSize + 3 >> 2) * cf_target;
      }
      else {
        DDS_data._4_4_ = 0x1907;
        cf_target = 3;
        if ((header.dwReserved1[10] & 1) != 0) {
          DDS_data._4_4_ = 0x1908;
          cf_target = 4;
        }
        width = header.dwFlags * header.dwSize * cf_target;
      }
      if ((header.sPixelFormat.dwAlphaBitMask & 0x200) == 0) {
        if (header.sCaps.dwReserved != 0) {
          result_string_pointer = "DDS image was not a cubemap";
          return 0;
        }
        opengl_texture_type = 0xde1;
        i = 0xde1;
        shift_offset = 0xde1;
      }
      else {
        if (header.sCaps.dwReserved == 0) {
          result_string_pointer = "DDS image was a cubemap";
          return 0;
        }
        iVar3 = query_cubemap_capability();
        if (iVar3 != 1) {
          result_string_pointer =
               "Direct upload of cubemap images not supported by the OpenGL driver";
          return 0;
        }
        opengl_texture_type = 0x8515;
        i = 0x851a;
        shift_offset = 0x8513;
      }
      if (((header.sPixelFormat.dwBBitMask & 0x400000) == 0) || (header.dwPitchOrLinearSize < 2)) {
        uncompressed = 0;
        height = width;
      }
      else {
        uncompressed = header.dwPitchOrLinearSize - 1;
        height = width;
        if (uVar4 == 1) {
          h._0_1_ = '\x02';
        }
        else {
          h._0_1_ = '\0';
        }
        for (w = 1; w <= uncompressed; w = w + 1) {
          byte_offset = header.dwFlags >> ((char)h + (char)w & 0x1fU);
          uStack_104 = header.dwSize >> ((char)h + (char)w & 0x1fU);
          if ((int)byte_offset < 1) {
            byte_offset = 1;
          }
          if ((int)uStack_104 < 1) {
            uStack_104 = 1;
          }
          height = byte_offset * uStack_104 * cf_target + height;
        }
      }
      img_data = (uchar *)malloc((ulong)height);
      local_b0 = reuse_texture_ID;
      if (reuse_texture_ID == 0) {
        glGenTextures(1,&local_b0);
      }
      glBindTexture(shift_offset,local_b0);
      for (ogl_target_end = opengl_texture_type; ogl_target_end <= (uint)i;
          ogl_target_end = ogl_target_end + 1) {
        if ((uint)buffer_length < S3TC_type + height) {
          glDeleteTextures(1,&local_b0);
          local_b0 = 0;
          ogl_target_end = i + 1;
          result_string_pointer = "DDS file was too small for expected image data";
        }
        else {
          w_1 = width;
          memcpy(img_data,buffer + S3TC_type,(ulong)height);
          S3TC_type = height + S3TC_type;
          if (uVar4 == 1) {
            (*soilGlCompressedTexImage2D)
                      (ogl_target_end,0,DDS_data._4_4_,header.dwFlags,header.dwSize,0,width,img_data
                      );
          }
          else {
            for (w = 0; (uint)w < height; w = cf_target + w) {
              uVar1 = img_data[w];
              img_data[w] = img_data[w + 2];
              img_data[w + 2] = uVar1;
            }
            glTexImage2D(ogl_target_end,0,DDS_data._4_4_,header.dwFlags,header.dwSize,0,
                         DDS_data._4_4_,0x1401,img_data);
          }
          for (w = 1; w <= uncompressed; w = w + 1) {
            mip_size = header.dwFlags >> ((byte)w & 0x1f);
            clamp_mode = header.dwSize >> ((byte)w & 0x1f);
            if (mip_size < 1) {
              mip_size = 1;
            }
            if ((int)clamp_mode < 1) {
              clamp_mode = 1;
            }
            if (uVar4 == 1) {
              local_118 = ((mip_size + 3) / 4) * ((int)(clamp_mode + 3) / 4) * cf_target;
              (*soilGlCompressedTexImage2D)
                        (ogl_target_end,w,DDS_data._4_4_,mip_size,clamp_mode,0,local_118,
                         img_data + (uint)w_1);
            }
            else {
              local_118 = mip_size * clamp_mode * cf_target;
              glTexImage2D(ogl_target_end,w,DDS_data._4_4_,mip_size,clamp_mode,0,DDS_data._4_4_,
                           0x1401,img_data + (uint)w_1);
            }
            w_1 = local_118 + w_1;
          }
          result_string_pointer = "DDS file loaded";
        }
      }
      SOIL_free_image_data(img_data);
      if (local_b0 != 0) {
        if (uncompressed < 1) {
          glTexParameteri(shift_offset,0x2800,0x2601);
          glTexParameteri(shift_offset,0x2801,0x2601);
        }
        else {
          glTexParameteri(shift_offset,0x2800,0x2601);
          glTexParameteri(shift_offset,0x2801,0x2703);
        }
        if ((header.dwReserved2 & 4) == 0) {
          glTexParameteri(shift_offset,0x2802,0x2900);
          glTexParameteri(shift_offset,0x2803,0x2900);
          glTexParameteri(shift_offset,0x8072,0x2900);
        }
        else {
          glTexParameteri(shift_offset,0x2802,0x2901);
          glTexParameteri(shift_offset,0x2803,0x2901);
          glTexParameteri(shift_offset,0x8072,0x2901);
        }
      }
    }
    buffer_local._4_4_ = local_b0;
  }
  return buffer_local._4_4_;
}

Assistant:

unsigned int SOIL_direct_load_DDS_from_memory(
		const unsigned char *const buffer,
		int buffer_length,
		unsigned int reuse_texture_ID,
		int flags,
		int loading_as_cubemap )
{
	/*	variables	*/
	DDS_header header;
	unsigned int buffer_index = 0;
	unsigned int tex_ID = 0;
	/*	file reading variables	*/
	unsigned int S3TC_type = 0;
	unsigned char *DDS_data;
	unsigned int DDS_main_size;
	unsigned int DDS_full_size;
	unsigned int width, height;
	int mipmaps, cubemap, uncompressed, block_size = 16;
	unsigned int flag;
	unsigned int cf_target, ogl_target_start, ogl_target_end;
	unsigned int opengl_texture_type;
	int i;
	/*	1st off, does the filename even exist?	*/
	if( NULL == buffer )
	{
		/*	we can't do it!	*/
		result_string_pointer = "NULL buffer";
		return 0;
	}
	if( buffer_length < sizeof( DDS_header ) )
	{
		/*	we can't do it!	*/
		result_string_pointer = "DDS file was too small to contain the DDS header";
		return 0;
	}
	/*	try reading in the header	*/
	memcpy ( (void*)(&header), (const void *)buffer, sizeof( DDS_header ) );
	buffer_index = sizeof( DDS_header );
	/*	guilty until proven innocent	*/
	result_string_pointer = "Failed to read a known DDS header";
	/*	validate the header (warning, "goto"'s ahead, shield your eyes!!)	*/
	flag = ('D'<<0)|('D'<<8)|('S'<<16)|(' '<<24);
	if( header.dwMagic != flag ) {goto quick_exit;}
	if( header.dwSize != 124 ) {goto quick_exit;}
	/*	I need all of these	*/
	flag = DDSD_CAPS | DDSD_HEIGHT | DDSD_WIDTH | DDSD_PIXELFORMAT;
	if( (header.dwFlags & flag) != flag ) {goto quick_exit;}
	/*	According to the MSDN spec, the dwFlags should contain
		DDSD_LINEARSIZE if it's compressed, or DDSD_PITCH if
		uncompressed.  Some DDS writers do not conform to the
		spec, so I need to make my reader more tolerant	*/
	/*	I need one of these	*/
	flag = DDPF_FOURCC | DDPF_RGB;
	if( (header.sPixelFormat.dwFlags & flag) == 0 ) {goto quick_exit;}
	if( header.sPixelFormat.dwSize != 32 ) {goto quick_exit;}
	if( (header.sCaps.dwCaps1 & DDSCAPS_TEXTURE) == 0 ) {goto quick_exit;}
	/*	make sure it is a type we can upload	*/
	if( (header.sPixelFormat.dwFlags & DDPF_FOURCC) &&
		!(
		(header.sPixelFormat.dwFourCC == (('D'<<0)|('X'<<8)|('T'<<16)|('1'<<24))) ||
		(header.sPixelFormat.dwFourCC == (('D'<<0)|('X'<<8)|('T'<<16)|('3'<<24))) ||
		(header.sPixelFormat.dwFourCC == (('D'<<0)|('X'<<8)|('T'<<16)|('5'<<24)))
		) )
	{
		goto quick_exit;
	}
	/*	OK, validated the header, let's load the image data	*/
	result_string_pointer = "DDS header loaded and validated";
	width = header.dwWidth;
	height = header.dwHeight;
	uncompressed = 1 - (header.sPixelFormat.dwFlags & DDPF_FOURCC) / DDPF_FOURCC;
	cubemap = (header.sCaps.dwCaps2 & DDSCAPS2_CUBEMAP) / DDSCAPS2_CUBEMAP;
	if( uncompressed )
	{
		S3TC_type = GL_RGB;
		block_size = 3;
		if( header.sPixelFormat.dwFlags & DDPF_ALPHAPIXELS )
		{
			S3TC_type = GL_RGBA;
			block_size = 4;
		}
		DDS_main_size = width * height * block_size;
	} else
	{
		/*	can we even handle direct uploading to OpenGL DXT compressed images?	*/
		if( query_DXT_capability() != SOIL_CAPABILITY_PRESENT )
		{
			/*	we can't do it!	*/
			result_string_pointer = "Direct upload of S3TC images not supported by the OpenGL driver";
			return 0;
		}
		/*	well, we know it is DXT1/3/5, because we checked above	*/
		switch( (header.sPixelFormat.dwFourCC >> 24) - '0' )
		{
		case 1:
			S3TC_type = SOIL_RGBA_S3TC_DXT1;
			block_size = 8;
			break;
		case 3:
			S3TC_type = SOIL_RGBA_S3TC_DXT3;
			block_size = 16;
			break;
		case 5:
			S3TC_type = SOIL_RGBA_S3TC_DXT5;
			block_size = 16;
			break;
		}
		DDS_main_size = ((width+3)>>2)*((height+3)>>2)*block_size;
	}
	if( cubemap )
	{
		/* does the user want a cubemap?	*/
		if( !loading_as_cubemap )
		{
			/*	we can't do it!	*/
			result_string_pointer = "DDS image was a cubemap";
			return 0;
		}
		/*	can we even handle cubemaps with the OpenGL driver?	*/
		if( query_cubemap_capability() != SOIL_CAPABILITY_PRESENT )
		{
			/*	we can't do it!	*/
			result_string_pointer = "Direct upload of cubemap images not supported by the OpenGL driver";
			return 0;
		}
		ogl_target_start = SOIL_TEXTURE_CUBE_MAP_POSITIVE_X;
		ogl_target_end =   SOIL_TEXTURE_CUBE_MAP_NEGATIVE_Z;
		opengl_texture_type = SOIL_TEXTURE_CUBE_MAP;
	} else
	{
		/* does the user want a non-cubemap?	*/
		if( loading_as_cubemap )
		{
			/*	we can't do it!	*/
			result_string_pointer = "DDS image was not a cubemap";
			return 0;
		}
		ogl_target_start = GL_TEXTURE_2D;
		ogl_target_end =   GL_TEXTURE_2D;
		opengl_texture_type = GL_TEXTURE_2D;
	}
	if( (header.sCaps.dwCaps1 & DDSCAPS_MIPMAP) && (header.dwMipMapCount > 1) )
	{
		int shift_offset;
		mipmaps = header.dwMipMapCount - 1;
		DDS_full_size = DDS_main_size;
		if( uncompressed )
		{
			/*	uncompressed DDS, simple MIPmap size calculation	*/
			shift_offset = 0;
		} else
		{
			/*	compressed DDS, MIPmap size calculation is block based	*/
			shift_offset = 2;
		}
		for( i = 1; i <= mipmaps; ++ i )
		{
			int w, h;
			w = width >> (shift_offset + i);
			h = height >> (shift_offset + i);
			if( w < 1 )
			{
				w = 1;
			}
			if( h < 1 )
			{
				h = 1;
			}
			DDS_full_size += w*h*block_size;
		}
	} else
	{
		mipmaps = 0;
		DDS_full_size = DDS_main_size;
	}
	DDS_data = (unsigned char*)malloc( DDS_full_size );
	/*	got the image data RAM, create or use an existing OpenGL texture handle	*/
	tex_ID = reuse_texture_ID;
	if( tex_ID == 0 )
	{
		glGenTextures( 1, &tex_ID );
	}
	/*  bind an OpenGL texture ID	*/
	glBindTexture( opengl_texture_type, tex_ID );
	/*	do this for each face of the cubemap!	*/
	for( cf_target = ogl_target_start; cf_target <= ogl_target_end; ++cf_target )
	{
		if( buffer_index + DDS_full_size <= buffer_length )
		{
			unsigned int byte_offset = DDS_main_size;
			memcpy( (void*)DDS_data, (const void*)(&buffer[buffer_index]), DDS_full_size );
			buffer_index += DDS_full_size;
			/*	upload the main chunk	*/
			if( uncompressed )
			{
				/*	and remember, DXT uncompressed uses BGR(A),
					so swap to RGB(A) for ALL MIPmap levels	*/
				for( i = 0; i < DDS_full_size; i += block_size )
				{
					unsigned char temp = DDS_data[i];
					DDS_data[i] = DDS_data[i+2];
					DDS_data[i+2] = temp;
				}
				glTexImage2D(
					cf_target, 0,
					S3TC_type, width, height, 0,
					S3TC_type, GL_UNSIGNED_BYTE, DDS_data );
			} else
			{
				soilGlCompressedTexImage2D(
					cf_target, 0,
					S3TC_type, width, height, 0,
					DDS_main_size, DDS_data );
			}
			/*	upload the mipmaps, if we have them	*/
			for( i = 1; i <= mipmaps; ++i )
			{
				int w, h, mip_size;
				w = width >> i;
				h = height >> i;
				if( w < 1 )
				{
					w = 1;
				}
				if( h < 1 )
				{
					h = 1;
				}
				/*	upload this mipmap	*/
				if( uncompressed )
				{
					mip_size = w*h*block_size;
					glTexImage2D(
						cf_target, i,
						S3TC_type, w, h, 0,
						S3TC_type, GL_UNSIGNED_BYTE, &DDS_data[byte_offset] );
				} else
				{
					mip_size = ((w+3)/4)*((h+3)/4)*block_size;
					soilGlCompressedTexImage2D(
						cf_target, i,
						S3TC_type, w, h, 0,
						mip_size, &DDS_data[byte_offset] );
				}
				/*	and move to the next mipmap	*/
				byte_offset += mip_size;
			}
			/*	it worked!	*/
			result_string_pointer = "DDS file loaded";
		} else
		{
			glDeleteTextures( 1, & tex_ID );
			tex_ID = 0;
			cf_target = ogl_target_end + 1;
			result_string_pointer = "DDS file was too small for expected image data";
		}
	}/* end reading each face */
	SOIL_free_image_data( DDS_data );
	if( tex_ID )
	{
		/*	did I have MIPmaps?	*/
		if( mipmaps > 0 )
		{
			/*	instruct OpenGL to use the MIPmaps	*/
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MAG_FILTER, GL_LINEAR );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR );
		} else
		{
			/*	instruct OpenGL _NOT_ to use the MIPmaps	*/
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MAG_FILTER, GL_LINEAR );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_MIN_FILTER, GL_LINEAR );
		}
		/*	does the user want clamping, or wrapping?	*/
		if( flags & SOIL_FLAG_TEXTURE_REPEATS )
		{
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_S, GL_REPEAT );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_T, GL_REPEAT );
			glTexParameteri( opengl_texture_type, SOIL_TEXTURE_WRAP_R, GL_REPEAT );
		} else
		{
			/*	unsigned int clamp_mode = SOIL_CLAMP_TO_EDGE;	*/
			unsigned int clamp_mode = GL_CLAMP;
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_S, clamp_mode );
			glTexParameteri( opengl_texture_type, GL_TEXTURE_WRAP_T, clamp_mode );
			glTexParameteri( opengl_texture_type, SOIL_TEXTURE_WRAP_R, clamp_mode );
		}
	}

quick_exit:
	/*	report success or failure	*/
	return tex_ID;
}